

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * jsonnet::internal::lex_number
                   (string *__return_storage_ptr__,char **c,string *filename,Location *begin)

{
  byte bVar1;
  ostream *poVar2;
  StaticError *pSVar3;
  undefined *puVar4;
  undefined4 uVar5;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    bVar1 = **c;
    switch(uVar5) {
    case 0:
      bVar1 = bVar1 - 0x30;
      if (9 < bVar1) {
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"couldn\'t lex number",(allocator<char> *)&local_1d8);
        StaticError::StaticError(pSVar3,filename,begin,(string *)&ss);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      puVar4 = &DAT_001fc9f4;
      goto LAB_001af23e;
    case 1:
switchD_001af1af_caseD_1:
      if (bVar1 == 0x2e) {
        uVar5 = 3;
      }
      else {
        if ((bVar1 != 0x65) && (bVar1 != 0x45)) {
          return __return_storage_ptr__;
        }
LAB_001af1f9:
        uVar5 = 5;
      }
      break;
    case 2:
      if (9 < bVar1 - 0x30) goto switchD_001af1af_caseD_1;
      uVar5 = 2;
      break;
    case 3:
      uVar5 = 4;
      if (9 < (byte)(bVar1 - 0x30)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar2 = std::operator<<(local_1a8,"couldn\'t lex number, junk after decimal point: ");
        std::operator<<(poVar2,**c);
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar3,filename,begin,&local_1d8);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      break;
    case 4:
      if (9 < bVar1 - 0x30) {
        if (bVar1 != 0x45) {
          uVar5 = 5;
          if (bVar1 != 0x65) {
            return __return_storage_ptr__;
          }
          break;
        }
        goto LAB_001af1f9;
      }
      uVar5 = 4;
      break;
    case 5:
      bVar1 = bVar1 - 0x2b;
      if ((0xe < bVar1) || ((0x7fe5U >> (bVar1 & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar2 = std::operator<<(local_1a8,"couldn\'t lex number, junk after \'E\': ");
        std::operator<<(poVar2,**c);
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar3,filename,begin,&local_1d8);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      puVar4 = &DAT_001fca2c;
LAB_001af23e:
      uVar5 = *(undefined4 *)(puVar4 + (ulong)bVar1 * 4);
      break;
    case 6:
      uVar5 = 7;
      if (9 < (byte)(bVar1 - 0x30)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar2 = std::operator<<(local_1a8,"couldn\'t lex number, junk after exponent sign: ");
        std::operator<<(poVar2,**c);
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar3,filename,begin,&local_1d8);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      break;
    case 7:
      uVar5 = 7;
      if (9 < (byte)(bVar1 - 0x30)) {
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    *c = *c + 1;
  } while( true );
}

Assistant:

std::string lex_number(const char *&c, const std::string &filename, const Location &begin)
{
    // This function should be understood with reference to the linked image:
    // https://www.json.org/img/number.png

    // Note, we deviate from the json.org documentation as follows:
    // There is no reason to lex negative numbers as atomic tokens, it is better to parse them
    // as a unary operator combined with a numeric literal.  This avoids x-1 being tokenized as
    // <identifier> <number> instead of the intended <identifier> <binop> <number>.

    enum State {
        BEGIN,
        AFTER_ZERO,
        AFTER_ONE_TO_NINE,
        AFTER_DOT,
        AFTER_DIGIT,
        AFTER_E,
        AFTER_EXP_SIGN,
        AFTER_EXP_DIGIT
    } state;

    std::string r;

    state = BEGIN;
    while (true) {
        switch (state) {
            case BEGIN:
                switch (*c) {
                    case '0': state = AFTER_ZERO; break;

                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: throw StaticError(filename, begin, "couldn't lex number");
                }
                break;

            case AFTER_ZERO:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    default: goto end;
                }
                break;

            case AFTER_ONE_TO_NINE:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: goto end;
                }
                break;

            case AFTER_DOT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after decimal point: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_DIGIT:
                switch (*c) {
                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: goto end;
                }
                break;

            case AFTER_E:
                switch (*c) {
                    case '+':
                    case '-': state = AFTER_EXP_SIGN; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after 'E': " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_SIGN:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after exponent sign: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_DIGIT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: goto end;
                }
                break;
        }
        r += *c;
        c++;
    }
end:
    return r;
}